

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19656::IDLExportVisitor::setTargetNamespace
          (IDLExportVisitor *this,string *target_namespace)

{
  undefined1 local_48 [32];
  
  nameSplit((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48,target_namespace);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  local_48._0_8_ = (_List_node_base *)(local_48 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_48,(char)(local_48._16_8_ << 2));
  std::__cxx11::string::operator=((string *)&this->m_indent,(string *)local_48);
  if ((_List_node_base *)local_48._0_8_ != (_List_node_base *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  std::__cxx11::string::_M_assign((string *)&this->m_namespace);
  return;
}

Assistant:

void setTargetNamespace(std::string const& target_namespace)
        {
            size_t ns_size = namespaceIndentLevel(target_namespace);
            m_indent = string(ns_size * 4, ' ');
            m_namespace = target_namespace;
        }